

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cal_energy.cpp
# Opt level: O2

void Clash_detection_list
               (Structure *conf,vector<int,_std::allocator<int>_> *starts,
               vector<int,_std::allocator<int>_> *ends,vector<int,_std::allocator<int>_> *ResIdx,
               vector<int,_std::allocator<int>_> *ClashNum,vector<int,_std::allocator<int>_> *List)

{
  int iVar1;
  int iVar2;
  Atom *pAVar3;
  Atom *pAVar4;
  Structure *pSVar5;
  ulong uVar6;
  Residue *pRVar7;
  ulong uVar8;
  Residue *pRVar9;
  Residue *pRVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  Residue *pRVar15;
  ushort uVar16;
  int iVar17;
  Atom *pAVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  int clash_count;
  int local_94;
  Residue *local_90;
  ulong local_88;
  ulong local_80;
  Structure *local_78;
  vector<int,_std::allocator<int>_> *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  ulong local_60;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  ulong local_40;
  Residue *local_38;
  
  uVar6 = (ulong)((long)(List->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(List->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar8 = (ulong)((long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  local_40 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    local_40 = 0;
  }
  local_60 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    local_60 = 0;
  }
  local_80 = 0;
  local_78 = conf;
  local_70 = starts;
  local_68 = ends;
  local_58 = ResIdx;
  local_50 = ClashNum;
  local_48 = List;
  do {
    if (local_80 == local_60) {
      return;
    }
    for (local_94 = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[local_80]; clash_count = 0,
        local_94 <=
        (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[local_80]; local_94 = local_94 + 1) {
      pRVar7 = local_78->_res;
      if ((pRVar7[local_94]._type != 0) && (pRVar7[local_94]._type != 5)) {
        uVar6 = 0;
        pRVar10 = pRVar7;
        local_90 = pRVar7;
        while (uVar6 != local_40) {
          iVar11 = (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar6];
          lVar12 = (long)local_94;
          local_88 = uVar6;
          if (iVar11 == local_94) {
            pRVar15 = pRVar10 + iVar11;
            pRVar9 = pRVar10 + iVar11;
            iVar17 = clash_count;
            for (lVar12 = 6; pRVar7 = local_90, pRVar10 = local_90, lVar12 < pRVar15->_numAtom;
                lVar12 = lVar12 + 1) {
              iVar1 = pRVar9->_atom[lVar12]._type;
              if (iVar1 < 0x16 && iVar1 != -0x3039) {
                pAVar18 = pRVar9->_atom + lVar12;
                dVar21 = (pAVar18->super_Point).x;
                if (((((dVar21 != 0.0) || (NAN(dVar21))) ||
                     (dVar21 = (pAVar18->super_Point).y, dVar21 != 0.0)) ||
                    ((NAN(dVar21) || (dVar21 = (pAVar18->super_Point).z, dVar21 != 0.0)))) ||
                   (NAN(dVar21))) {
                  pAVar3 = local_90[iVar11]._atom;
                  pAVar18 = pAVar3 + lVar12;
                  for (lVar13 = 0; lVar13 != 0xa0; lVar13 = lVar13 + 0x50) {
                    iVar1 = *(int *)((long)&pAVar3[2]._type + lVar13);
                    lVar19 = (long)iVar1;
                    if (lVar19 != -0x3039 && lVar19 < 0x16) {
                      dVar21 = *(double *)((long)&pAVar3[2].super_Point.x + lVar13);
                      dVar23 = *(double *)((long)&pAVar3[2].super_Point.y + lVar13);
                      if ((((dVar21 != 0.0) || (NAN(dVar21))) ||
                          ((dVar23 != 0.0 ||
                           (((NAN(dVar23) ||
                             (dVar20 = *(double *)((long)&pAVar3[2].super_Point.z + lVar13),
                             dVar20 != 0.0)) || (NAN(dVar20))))))) &&
                         (dVar21 = (pAVar18->super_Point).x - dVar21,
                         dVar23 = (pAVar18->super_Point).y - dVar23,
                         dVar20 = (pAVar18->super_Point).z -
                                  *(double *)((long)&pAVar3[2].super_Point.z + lVar13),
                         dVar21 = dVar20 * dVar20 + dVar21 * dVar21 + dVar23 * dVar23,
                         dVar21 <= 64.0)) {
                        dVar21 = SQRT(dVar21);
                        iVar2 = pAVar3[lVar12]._type;
                        if (local_90[iVar11]._type == 1) {
                          if (iVar2 == 4) {
                            if (iVar1 == 0x10) {
LAB_0011de63:
                              if ((2.7 < dVar21) && (dVar21 < 3.3)) goto LAB_0011de8c;
                            }
                          }
                          else if (iVar2 == 0x10) {
                            if (((iVar1 == 0x10) && (1.8 < dVar21)) && (dVar21 < 2.2))
                            goto LAB_0011de8c;
                            if (iVar1 == 4) goto LAB_0011de63;
                          }
                        }
                        dVar21 = dVar21 / (Atom::radius[iVar2] + Atom::radius[lVar19]);
                        if (dVar21 <= 0.6) {
                          if (0.5 <= dVar21) {
                            iVar17 = iVar17 + 1;
                            clash_count = iVar17;
                          }
                          else {
                            iVar17 = iVar17 + 5;
                            clash_count = iVar17;
                          }
                        }
                      }
                    }
LAB_0011de8c:
                  }
                }
              }
            }
          }
          else if ((iVar11 <= local_94) ||
                  ((local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[local_80] < iVar11)) {
            if ((iVar11 < local_94) &&
               ((local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[local_80] <= iVar11)) {
              local_38 = pRVar7 + lVar12;
              pRVar15 = pRVar7 + lVar12;
              pRVar9 = pRVar7 + iVar11;
              iVar17 = clash_count;
              for (lVar13 = 6; pRVar7 = pRVar10, lVar13 < pRVar15->_numAtom; lVar13 = lVar13 + 1) {
                iVar1 = local_38->_atom[lVar13]._type;
                if (iVar1 < 0x16 && iVar1 != -0x3039) {
                  pAVar18 = local_38->_atom + lVar13;
                  dVar21 = (pAVar18->super_Point).x;
                  if ((((dVar21 != 0.0) || (NAN(dVar21))) ||
                      (dVar23 = (pAVar18->super_Point).y, dVar23 != 0.0)) ||
                     (((NAN(dVar23) || (dVar23 = (pAVar18->super_Point).z, dVar23 != 0.0)) ||
                      (NAN(dVar23))))) {
                    uVar16 = (ushort)*(undefined4 *)&pRVar9->_numAtom;
                    if ((short)uVar16 < 1) {
                      uVar16 = 0;
                    }
                    for (lVar19 = 0; (ulong)uVar16 * 0x50 - lVar19 != 0; lVar19 = lVar19 + 0x50) {
                      pAVar3 = pRVar9->_atom;
                      iVar1 = *(int *)((long)&pAVar3->_type + lVar19);
                      if (iVar1 < 0x16 && iVar1 != -0x3039) {
                        dVar23 = *(double *)((long)&(pAVar3->super_Point).x + lVar19);
                        dVar20 = *(double *)((long)&(pAVar3->super_Point).y + lVar19);
                        if ((((dVar23 != 0.0) || (NAN(dVar23))) ||
                            ((dVar20 != 0.0 ||
                             (((NAN(dVar20) ||
                               (dVar22 = *(double *)((long)&(pAVar3->super_Point).z + lVar19),
                               dVar22 != 0.0)) || (NAN(dVar22))))))) &&
                           (dVar20 = (pAVar18->super_Point).y - dVar20,
                           dVar22 = (pAVar18->super_Point).z -
                                    *(double *)((long)&(pAVar3->super_Point).z + lVar19),
                           dVar23 = dVar22 * dVar22 +
                                    (dVar21 - dVar23) * (dVar21 - dVar23) + dVar20 * dVar20,
                           dVar23 <= 64.0)) {
                          dVar23 = SQRT(dVar23);
                          iVar1 = pRVar10[lVar12]._atom[lVar13]._type;
                          iVar2 = *(int *)((long)&(pRVar10[iVar11]._atom)->_type + lVar19);
                          if ((pRVar10[lVar12]._type == 1) && (pRVar10[iVar11]._type == 1)) {
                            if (iVar1 == 4) {
                              if (iVar2 == 0x10) {
LAB_0011e065:
                                if ((2.7 < dVar23) && (dVar23 < 3.3)) goto LAB_0011e091;
                              }
                            }
                            else if (iVar1 == 0x10) {
                              if (((iVar2 == 0x10) && (1.8 < dVar23)) && (dVar23 < 2.2))
                              goto LAB_0011e091;
                              if (iVar2 == 4) goto LAB_0011e065;
                            }
                          }
                          dVar23 = dVar23 / (Atom::radius[iVar1] + Atom::radius[iVar2]);
                          if (dVar23 <= 0.6) {
                            if (0.5 <= dVar23) {
                              iVar17 = iVar17 + 1;
                              clash_count = iVar17;
                            }
                            else {
                              iVar17 = iVar17 + 5;
                              clash_count = iVar17;
                            }
                          }
                        }
                      }
LAB_0011e091:
                    }
                  }
                }
              }
            }
            else {
              dVar21 = Point::dis(&pRVar7[lVar12]._center.super_Point,
                                  &pRVar7[iVar11]._center.super_Point);
              pSVar5 = local_78;
              pRVar7 = local_78->_res;
              lVar12 = (long)local_94;
              if (Residue::size[pRVar7[lVar12]._type] + Residue::size[pRVar7[iVar11]._type] + 5.5 <=
                  dVar21) {
                dVar21 = Point::dis(&pRVar7[lVar12]._bbc.super_Point,
                                    &pRVar7[iVar11]._center.super_Point);
                pRVar7 = pSVar5->_res;
                pRVar10 = pRVar7;
                local_90 = pRVar7;
                if (Residue::bb_size + Residue::size[pRVar7[iVar11]._type] + 5.5 <= dVar21)
                goto LAB_0011e350;
                lVar12 = (long)local_94;
              }
              pRVar15 = pRVar7 + iVar11;
              iVar11 = clash_count;
              for (lVar13 = 6; pRVar10 = pRVar7, local_90 = pRVar7, lVar13 < pRVar7[lVar12]._numAtom
                  ; lVar13 = lVar13 + 1) {
                pAVar18 = pRVar7[lVar12]._atom;
                if (pAVar18[lVar13]._type < 0x16 && pAVar18[lVar13]._type != -0x3039) {
                  pAVar3 = pAVar18 + lVar13;
                  dVar21 = (pAVar3->super_Point).x;
                  if (((((dVar21 != 0.0) || (NAN(dVar21))) ||
                       (dVar21 = (pAVar3->super_Point).y, dVar21 != 0.0)) ||
                      ((NAN(dVar21) || (dVar21 = (pAVar3->super_Point).z, dVar21 != 0.0)))) ||
                     (NAN(dVar21))) {
                    uVar16 = (ushort)*(undefined4 *)&pRVar15->_numAtom;
                    if ((short)uVar16 < 1) {
                      uVar16 = 0;
                    }
                    for (lVar19 = 0; (ulong)uVar16 * 0x50 - lVar19 != 0; lVar19 = lVar19 + 0x50) {
                      pAVar4 = pRVar15->_atom;
                      iVar17 = *(int *)((long)&pAVar4->_type + lVar19);
                      lVar14 = (long)iVar17;
                      if (lVar14 != -0x3039 && lVar14 < 0x16) {
                        dVar21 = *(double *)((long)&(pAVar4->super_Point).x + lVar19);
                        dVar23 = *(double *)((long)&(pAVar4->super_Point).y + lVar19);
                        if ((((dVar21 != 0.0) || (NAN(dVar21))) ||
                            ((dVar23 != 0.0 ||
                             (((NAN(dVar23) ||
                               (dVar20 = *(double *)((long)&(pAVar4->super_Point).z + lVar19),
                               dVar20 != 0.0)) || (NAN(dVar20))))))) &&
                           (dVar21 = (pAVar3->super_Point).x - dVar21,
                           dVar23 = (pAVar3->super_Point).y - dVar23,
                           dVar20 = (pAVar3->super_Point).z -
                                    *(double *)((long)&(pAVar4->super_Point).z + lVar19),
                           dVar21 = dVar20 * dVar20 + dVar21 * dVar21 + dVar23 * dVar23,
                           dVar21 <= 64.0)) {
                          dVar21 = SQRT(dVar21);
                          iVar1 = pAVar18[lVar13]._type;
                          if ((pRVar7[lVar12]._type == 1) && (pRVar15->_type == 1)) {
                            if (iVar1 == 4) {
                              if (iVar17 == 0x10) {
LAB_0011e311:
                                if ((2.7 < dVar21) && (dVar21 < 3.3)) goto LAB_0011e33a;
                              }
                            }
                            else if (iVar1 == 0x10) {
                              if (((iVar17 == 0x10) && (1.8 < dVar21)) && (dVar21 < 2.2))
                              goto LAB_0011e33a;
                              if (iVar17 == 4) goto LAB_0011e311;
                            }
                          }
                          dVar21 = dVar21 / (Atom::radius[iVar1] + Atom::radius[lVar14]);
                          if (dVar21 <= 0.6) {
                            if (0.5 <= dVar21) {
                              iVar11 = iVar11 + 1;
                              clash_count = iVar11;
                            }
                            else {
                              iVar11 = iVar11 + 5;
                              clash_count = iVar11;
                            }
                          }
                        }
                      }
LAB_0011e33a:
                    }
                  }
                }
              }
            }
          }
LAB_0011e350:
          uVar6 = local_88 + 1;
        }
        if (clash_count != 0) {
          std::vector<int,_std::allocator<int>_>::push_back(local_58,&local_94);
          std::vector<int,_std::allocator<int>_>::push_back(local_50,&clash_count);
        }
      }
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

void Clash_detection_list(const Structure &conf, const vector<int> &starts, const vector<int> &ends, vector<int> &ResIdx,
                          vector<int> &ClashNum, const std::vector<int> &List) {
    int i, p, j, l, k, t, clash_count = 0;
    double disquare, dis, r, quot = 0;

    const int List_size = static_cast<int>(List.size());

    const int n_starts = static_cast<int>(starts.size());

    for (t = 0; t < n_starts; t++) {
        for (l = starts[t]; l <= ends[t]; l++) {
            if (conf._res[l]._type == 0 || conf._res[l]._type == 5)
                continue;
            for (p = 0; p < List_size; p++) {
                i = List[p];

                if (i == l) {
                    for (j = NUM_BB_ATOM; j < conf._res[l]._numAtom; j++) {
                        // skip undefined and H atoms
                        if (conf._res[l]._atom[j]._type == UNDEF || conf._res[l]._atom[j]._type >= 22)
                            continue;
                        if (conf._res[l]._atom[j].x == 0 && conf._res[l]._atom[j].y == 0 &&
                            conf._res[l]._atom[j].z == 0)
                            continue;

                        for (k = 2; k <= 3; ++k) {
                            if (conf._res[i]._atom[k]._type == UNDEF || conf._res[i]._atom[k]._type >= 22) continue;
                            if (conf._res[i]._atom[k].x == 0 && conf._res[i]._atom[k].y == 0 &&
                                conf._res[i]._atom[k].z == 0)
                                continue;

                            disquare = (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x) *
                                       (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x)
                                       + (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y) *
                                         (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y)
                                       + (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z) *
                                         (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z);
                            if (disquare <= PF_DIS_CUT_SQUARE) {
                                dis = sqrt(disquare);
                                r = Atom::radius[conf._res[l]._atom[j]._type] +
                                    Atom::radius[conf._res[i]._atom[k]._type];
                                if (conf._res[l]._type == 1 && conf._res[i]._type == 1) {
                                    if ((conf._res[l]._atom[j]._type == 16) && (conf._res[i]._atom[k]._type == 16) &&
                                        (dis > 1.8 && dis < 2.2)) {
                                        continue;
                                    }
                                    else if (((conf._res[l]._atom[j]._type == 16 && conf._res[i]._atom[k]._type == 4) ||
                                              (conf._res[l]._atom[j]._type == 4 &&
                                               conf._res[i]._atom[k]._type == 16)) && (dis > 2.7 && dis < 3.3)) {
                                        continue;
                                    }
                                    else {
                                        quot = dis / r;
                                        if (quot <= VDW_CLASH_CUTOFF) {
                                            if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                clash_count++;
                                            else {
                                                clash_count += 5;
                                            }
                                        }
                                    }
                                }
                                else {
                                    quot = dis / r;
                                    if (quot <= VDW_CLASH_CUTOFF) {
                                        if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                            clash_count++;
                                        else {
                                            clash_count += 5;
                                        }
                                    }
                                }
                            }
                        }
                    }

                }
                else if (i > l && i <= ends[t]) continue;
                else if (i >= starts[t] && i < l) {
                    for (j = NUM_BB_ATOM; j < conf._res[l]._numAtom; j++) {
                        // skip undefined and H atoms
                        if (conf._res[l]._atom[j]._type == UNDEF || conf._res[l]._atom[j]._type >= 22)
                            continue;
                        if (conf._res[l]._atom[j].x == 0 && conf._res[l]._atom[j].y == 0 &&
                            conf._res[l]._atom[j].z == 0)
                            continue;

                        for (k = 0; k < conf._res[i]._numAtom; ++k) {
                            if (conf._res[i]._atom[k]._type == UNDEF || conf._res[i]._atom[k]._type >= 22) continue;
                            if (conf._res[i]._atom[k].x == 0 && conf._res[i]._atom[k].y == 0 &&
                                conf._res[i]._atom[k].z == 0)
                                continue;

                            disquare = (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x) *
                                       (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x)
                                       + (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y) *
                                         (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y)
                                       + (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z) *
                                         (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z);
                            if (disquare <= PF_DIS_CUT_SQUARE) {
                                dis = sqrt(disquare);
                                r = Atom::radius[conf._res[l]._atom[j]._type] +
                                    Atom::radius[conf._res[i]._atom[k]._type];
                                if (conf._res[l]._type == 1 && conf._res[i]._type == 1) {
                                    if ((conf._res[l]._atom[j]._type == 16) && (conf._res[i]._atom[k]._type == 16) &&
                                        (dis > 1.8 && dis < 2.2)) {
                                        continue;
                                    }
                                    else if (((conf._res[l]._atom[j]._type == 16 && conf._res[i]._atom[k]._type == 4) ||
                                              (conf._res[l]._atom[j]._type == 4 &&
                                               conf._res[i]._atom[k]._type == 16)) && (dis > 2.7 && dis < 3.3)) {
                                        continue;
                                    }
                                    else {
                                        quot = dis / r;
                                        if (quot <= VDW_CLASH_CUTOFF) {
                                            if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                clash_count++;
                                            else {
                                                clash_count += 5;
                                            }
                                        }
                                    }
                                }
                                else {
                                    quot = dis / r;
                                    if (quot <= VDW_CLASH_CUTOFF) {
                                        if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                            clash_count++;
                                        else {
                                            clash_count += 5;
                                        }
                                    }
                                }
                            }
                        }
                    }

                }
                else {
                    if ((conf._res[l]._center.dis(conf._res[i]._center) <
                         Residue::size[conf._res[l]._type] + Residue::size[conf._res[i]._type] + CUB_SIZE) ||
                        (conf._res[l]._bbc.dis(conf._res[i]._center) <
                         Residue::bb_size + Residue::size[conf._res[i]._type] + CUB_SIZE)) {
                        for (j = NUM_BB_ATOM; j < conf._res[l]._numAtom; j++) {
                            // skip undefined and H atoms
                            if (conf._res[l]._atom[j]._type == UNDEF || conf._res[l]._atom[j]._type >= 22)
                                continue;
                            if (conf._res[l]._atom[j].x == 0 && conf._res[l]._atom[j].y == 0 &&
                                conf._res[l]._atom[j].z == 0)
                                continue;
                            for (k = 0; k < conf._res[i]._numAtom; ++k) {
                                if (conf._res[i]._atom[k]._type == UNDEF || conf._res[i]._atom[k]._type >= 22) continue;
                                if (conf._res[i]._atom[k].x == 0 && conf._res[i]._atom[k].y == 0 &&
                                    conf._res[i]._atom[k].z == 0)
                                    continue;

                                disquare = (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x) *
                                           (conf._res[l]._atom[j].x - conf._res[i]._atom[k].x)
                                           + (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y) *
                                             (conf._res[l]._atom[j].y - conf._res[i]._atom[k].y)
                                           + (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z) *
                                             (conf._res[l]._atom[j].z - conf._res[i]._atom[k].z);
                                if (disquare <= PF_DIS_CUT_SQUARE) {
                                    dis = sqrt(disquare);
                                    r = Atom::radius[conf._res[l]._atom[j]._type] +
                                        Atom::radius[conf._res[i]._atom[k]._type];
                                    if (conf._res[l]._type == 1 && conf._res[i]._type == 1) {
                                        if ((conf._res[l]._atom[j]._type == 16) &&
                                            (conf._res[i]._atom[k]._type == 16) && (dis > 1.8 && dis < 2.2)) {
                                            continue;
                                        }
                                        else if (((conf._res[l]._atom[j]._type == 16 &&
                                                   conf._res[i]._atom[k]._type == 4) ||
                                                  (conf._res[l]._atom[j]._type == 4 &&
                                                   conf._res[i]._atom[k]._type == 16)) && (dis > 2.7 && dis < 3.3)) {
                                            continue;
                                        }
                                        else {
                                            quot = dis / r;
                                            if (quot <= VDW_CLASH_CUTOFF) {
                                                if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                    clash_count++;
                                                else {
                                                    clash_count += 5;
                                                }
                                            }
                                        }
                                    }
                                    else {
                                        quot = dis / r;
                                        if (quot <= VDW_CLASH_CUTOFF) {
                                            if (quot <= VDW_CLASH_CUTOFF && quot >= 0.5)
                                                clash_count++;
                                            else {
                                                clash_count += 5;
                                            }
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
            if (clash_count != 0) {
                ResIdx.push_back(l);
                ClashNum.push_back(clash_count);
            }
            clash_count = 0;
        }
    }
}